

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O0

MppSThdGrp mpp_sthd_grp_get(char *name,RK_S32 count)

{
  MppSThdImpl *thd;
  RK_S32 i;
  pthread_mutexattr_t attr;
  RK_S32 total_size;
  RK_S32 elem_size;
  MppSThdGrpImpl *grp;
  char *pcStack_10;
  RK_S32 count_local;
  char *name_local;
  
  _total_size = (char *)0x0;
  grp._4_4_ = count;
  pcStack_10 = name;
  if (0 < count) {
    attr.__align = 0x88;
    i = count * 0x88 + 0x40;
    _total_size = (char *)mpp_osal_calloc("mpp_sthd_grp_get",(long)i);
    if (_total_size != (char *)0x0) {
      if (pcStack_10 == (char *)0x0) {
        pcStack_10 = "mpp_sthd_grp";
      }
      snprintf(_total_size,0xf,"%s",pcStack_10);
      *(uint *)(_total_size + 0x10) = grp._4_4_;
      for (thd._0_4_ = 0; (int)thd < (int)grp._4_4_; thd._0_4_ = (int)thd + 1) {
        ((MppSThdImpl *)(_total_size + (long)(int)thd * 0x88 + 0x40))->name = _total_size;
        mpp_sthd_init((MppSThdImpl *)(_total_size + (long)(int)thd * 0x88 + 0x40),(int)thd);
      }
      pthread_mutexattr_init((pthread_mutexattr_t *)((long)&thd + 4));
      pthread_mutexattr_settype((pthread_mutexattr_t *)((long)&thd + 4),1);
      pthread_mutex_init((pthread_mutex_t *)(_total_size + 0x18),
                         (pthread_mutexattr_t *)((long)&thd + 4));
      pthread_mutexattr_destroy((pthread_mutexattr_t *)((long)&thd + 4));
    }
  }
  if (_total_size == (char *)0x0) {
    _mpp_log_l(2,"mpp_thread","can NOT create %d threads group\n","mpp_sthd_grp_get",
               (ulong)grp._4_4_);
  }
  return _total_size;
}

Assistant:

MppSThdGrp mpp_sthd_grp_get(const char *name, RK_S32 count)
{
    MppSThdGrpImpl *grp = NULL;

    if (count > 0) {
        RK_S32 elem_size = MPP_ALIGN(sizeof(MppSThdImpl), 8);
        RK_S32 total_size = MPP_ALIGN(sizeof(MppSThdGrpImpl), 8) + count * elem_size;

        grp = mpp_calloc_size(MppSThdGrpImpl, total_size);
        if (grp) {
            pthread_mutexattr_t attr;
            RK_S32 i;

            if (!name)
                name = "mpp_sthd_grp";

            snprintf(grp->name, THREAD_NAME_LEN - 1, "%s", name);

            grp->count = count;
            for (i = 0; i < count; i++) {
                MppSThdImpl *thd = &grp->thds[i];

                thd->name = grp->name;
                mpp_sthd_init(thd, i);
            }

            pthread_mutexattr_init(&attr);
            pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
            pthread_mutex_init(&grp->lock, &attr);
            pthread_mutexattr_destroy(&attr);
        }
    }

    if (!grp)
        mpp_err_f("can NOT create %d threads group\n", count);

    return grp;
}